

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uart_ow.c
# Opt level: O0

uint8_t mraa_uart_ow_crc8(uint8_t *buffer,uint16_t length)

{
  byte bVar1;
  byte local_18;
  char local_17;
  ushort local_16;
  byte local_13;
  uint8_t feedback_bit;
  uint8_t data;
  uint8_t bit_counter;
  uint16_t loop_count;
  uint8_t crc;
  uint16_t length_local;
  uint8_t *buffer_local;
  
  local_13 = 0;
  for (local_16 = 0; local_16 != length; local_16 = local_16 + 1) {
    local_18 = buffer[local_16];
    local_17 = '\b';
    do {
      bVar1 = (local_13 ^ local_18) & 1;
      if (bVar1 == 1) {
        local_13 = local_13 ^ 0x18;
      }
      local_13 = (byte)((int)(uint)local_13 >> 1);
      if (bVar1 == 1) {
        local_13 = local_13 | 0x80;
      }
      local_18 = (byte)((int)(uint)local_18 >> 1);
      local_17 = local_17 + -1;
    } while (local_17 != '\0');
  }
  return local_13;
}

Assistant:

uint8_t
mraa_uart_ow_crc8(uint8_t* buffer, uint16_t length)
{
    // 0x18 = X ^ 8 + X ^ 5 + X ^ 4 + X ^ 0
    static const uint8_t CRC8POLY = 0x18;

    uint8_t crc = 0x00;
    uint16_t loop_count;
    uint8_t bit_counter;
    uint8_t data;
    uint8_t feedback_bit;

    for (loop_count = 0; loop_count != length; loop_count++) {
        data = buffer[loop_count];
        bit_counter = 8;
        do {
            feedback_bit = (crc ^ data) & 0x01;
            if (feedback_bit == 0x01)
                crc = crc ^ CRC8POLY;
            crc = (crc >> 1) & 0x7F;
            if (feedback_bit == 0x01)
                crc = crc | 0x80;
            data = data >> 1;
            bit_counter--;
        } while (bit_counter > 0);
    }

    return crc;
}